

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client-handshake.c
# Opt level: O0

int lws_getaddrinfo46(lws *wsi,char *ads,addrinfo **result)

{
  uint uVar1;
  undefined1 local_50 [4];
  int n;
  addrinfo hints;
  addrinfo **result_local;
  char *ads_local;
  lws *wsi_local;
  
  hints.ai_next = (addrinfo *)result;
  memset(local_50,0,0x30);
  (hints.ai_next)->ai_flags = 0;
  (hints.ai_next)->ai_family = 0;
  hints.ai_flags = 1;
  n = 0;
  uVar1 = getaddrinfo(ads,(char *)0x0,(addrinfo *)local_50,(addrinfo **)hints.ai_next);
  _lws_log(8,"%s: getaddrinfo \'%s\' says %d\n","lws_getaddrinfo46",ads,(ulong)uVar1);
  return uVar1;
}

Assistant:

static int
lws_getaddrinfo46(struct lws *wsi, const char *ads, struct addrinfo **result)
{
	struct addrinfo hints;
	int n;

	memset(&hints, 0, sizeof(hints));
	*result = NULL;

	hints.ai_socktype = SOCK_STREAM;

#ifdef LWS_WITH_IPV6
	if (wsi->ipv6) {

#if !defined(__ANDROID__)
		hints.ai_family = AF_UNSPEC;
		hints.ai_flags = AI_V4MAPPED;
#endif
	} else
#endif
	{
		hints.ai_family = PF_UNSPEC;
	}

	n = getaddrinfo(ads, NULL, &hints, result);

	lwsl_info("%s: getaddrinfo '%s' says %d\n", __func__, ads, n);

	return n;
}